

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugPubTable.cpp
# Opt level: O1

void __thiscall
llvm::DWARFDebugPubTable::DWARFDebugPubTable
          (DWARFDebugPubTable *this,DWARFObject *Obj,DWARFSection *Sec,bool LittleEndian,
          bool GnuStyle)

{
  long lVar1;
  iterator __position;
  byte bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  undefined7 in_register_00000081;
  ulong uVar6;
  undefined1 local_b0 [8];
  DWARFDataExtractor PubNames;
  undefined1 local_78 [16];
  StringRef local_68;
  pointer pEStack_58;
  pointer local_50;
  undefined4 local_44;
  char *local_40;
  uint64_t Offset;
  
  (this->Sets).
  super__Vector_base<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Sets).
  super__Vector_base<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Sets).
  super__Vector_base<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_44 = (undefined4)CONCAT71(in_register_00000081,GnuStyle);
  this->GnuStyle = GnuStyle;
  local_b0 = (undefined1  [8])(Sec->Data).Data;
  PubNames.super_DataExtractor.Data.Data = (char *)(Sec->Data).Length;
  PubNames.super_DataExtractor.Data.Length._1_1_ = 0;
  local_40 = (char *)0x0;
  if (PubNames.super_DataExtractor.Data.Data != (char *)0x0) {
    PubNames.super_DataExtractor.Data.Length._0_1_ = LittleEndian;
    PubNames.super_DataExtractor._16_8_ = Obj;
    PubNames.Obj = (DWARFObject *)Sec;
    PubNames.Section = Sec;
    Offset = (uint64_t)this;
    do {
      local_78._0_8_ = local_78._0_8_ & 0xffff000000000000;
      local_78._8_4_ = GIEK_NONE;
      local_78._12_4_ = GIEL_EXTERNAL;
      local_68.Data = (char *)(local_68._4_8_ << 0x20);
      local_50 = (pointer)0x0;
      local_68.Length = 0;
      pEStack_58 = (pointer)0x0;
      std::vector<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>::
      emplace_back<llvm::DWARFDebugPubTable::Set>
                ((vector<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>
                  *)Offset,(Set *)local_78);
      if ((pointer)local_68.Length != (pointer)0x0) {
        operator_delete((void *)local_68.Length,(long)local_50 - local_68.Length);
      }
      lVar1 = *(long *)(Offset + 8);
      uVar4 = DataExtractor::getU32((DataExtractor *)local_b0,(uint64_t *)&local_40,(Error *)0x0);
      *(uint32_t *)(lVar1 + -0x30) = uVar4;
      uVar3 = DataExtractor::getU16((DataExtractor *)local_b0,(uint64_t *)&local_40,(Error *)0x0);
      *(uint16_t *)(lVar1 + -0x2c) = uVar3;
      uVar5 = DWARFDataExtractor::getRelocatedValue
                        ((DWARFDataExtractor *)local_b0,4,(uint64_t *)&local_40,(uint64_t *)0x0,
                         (Error *)0x0);
      *(uint64_t *)(lVar1 + -0x28) = uVar5;
      uVar4 = DataExtractor::getU32((DataExtractor *)local_b0,(uint64_t *)&local_40,(Error *)0x0);
      *(uint32_t *)(lVar1 + -0x20) = uVar4;
      do {
        if ((char *)((PubNames.Section)->Data).Length <= local_40) break;
        uVar4 = DataExtractor::getU32((DataExtractor *)local_b0,(uint64_t *)&local_40,(Error *)0x0);
        if (uVar4 == 0) break;
        if ((char)local_44 == '\0') {
          uVar6 = 0;
        }
        else {
          bVar2 = DataExtractor::getU8((DataExtractor *)local_b0,(uint64_t *)&local_40,(Error *)0x0)
          ;
          uVar6 = (ulong)bVar2;
        }
        local_68 = DataExtractor::getCStrRef((DataExtractor *)local_b0,(uint64_t *)&local_40);
        local_78._0_8_ = ZEXT48(uVar4);
        local_78._8_8_ = CONCAT44((uint)uVar6 >> 7,(int)(uVar6 >> 4)) & 0xffffffff00000007;
        __position._M_current = *(Entry **)(lVar1 + -0x10);
        if (__position._M_current == *(Entry **)(lVar1 + -8)) {
          std::
          vector<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
          ::_M_realloc_insert<llvm::DWARFDebugPubTable::Entry>
                    ((vector<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
                      *)(lVar1 + -0x18),__position,(Entry *)local_78);
        }
        else {
          ((__position._M_current)->Name).Data = local_68.Data;
          ((__position._M_current)->Name).Length = local_68.Length;
          (__position._M_current)->SecOffset = local_78._0_8_;
          ((__position._M_current)->Descriptor).Kind = local_78._8_4_;
          ((__position._M_current)->Descriptor).Linkage = local_78._12_4_;
          *(long *)(lVar1 + -0x10) = *(long *)(lVar1 + -0x10) + 0x20;
        }
      } while (uVar4 != 0);
    } while (local_40 < PubNames.super_DataExtractor.Data.Data);
  }
  return;
}

Assistant:

DWARFDebugPubTable::DWARFDebugPubTable(const DWARFObject &Obj,
                                       const DWARFSection &Sec,
                                       bool LittleEndian, bool GnuStyle)
    : GnuStyle(GnuStyle) {
  DWARFDataExtractor PubNames(Obj, Sec, LittleEndian, 0);
  uint64_t Offset = 0;
  while (PubNames.isValidOffset(Offset)) {
    Sets.push_back({});
    Set &SetData = Sets.back();

    SetData.Length = PubNames.getU32(&Offset);
    SetData.Version = PubNames.getU16(&Offset);
    SetData.Offset = PubNames.getRelocatedValue(4, &Offset);
    SetData.Size = PubNames.getU32(&Offset);

    while (Offset < Sec.Data.size()) {
      uint32_t DieRef = PubNames.getU32(&Offset);
      if (DieRef == 0)
        break;
      uint8_t IndexEntryValue = GnuStyle ? PubNames.getU8(&Offset) : 0;
      StringRef Name = PubNames.getCStrRef(&Offset);
      SetData.Entries.push_back(
          {DieRef, PubIndexEntryDescriptor(IndexEntryValue), Name});
    }
  }
}